

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmWhileFunctionBlocker::Replay
          (cmWhileFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  pointer lff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int code;
  PolicyStatus PVar3;
  cmListFileContext *pcVar4;
  size_type __n;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ulong uVar5;
  string *this_00;
  cmake *this_01;
  PolicyID id;
  WrapQuotes in_R8D;
  string_view str;
  undefined1 auVar6 [16];
  char local_2d1;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [16];
  string local_280;
  cmExpandedCommandArgument *local_260;
  cmExpandedCommandArgument *i;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *__range2_1;
  undefined1 local_238 [8];
  string err;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  undefined1 local_1d8 [8];
  cmExecutionStatus status;
  cmListFileFunction *fn;
  iterator __end2;
  iterator __begin2;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2;
  cmListFileBacktrace local_160;
  undefined1 local_150 [8];
  cmConditionEvaluator conditionEvaluator;
  undefined1 local_118 [4];
  MessageType messageType;
  string errorString;
  anon_class_8_1_3fcf6657 aStack_f0;
  bool enforceError;
  anon_class_8_1_3fcf6657 expandArgs;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileContext local_c0;
  undefined1 local_50 [24];
  cmListFileBacktrace whileBT;
  cmMakefile *mf;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmWhileFunctionBlocker *this_local;
  
  whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cmExecutionStatus::GetMakefile(inStatus);
  cmMakefile::GetBacktrace((cmMakefile *)local_50);
  pcVar4 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  cmListFileContext::cmListFileContext(&local_c0,pcVar4);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_50 + 0x10),
             (cmListFileContext *)local_50);
  cmListFileContext::~cmListFileContext(&local_c0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             &expandArgs);
  __n = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(&this->Args);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             &expandArgs,__n);
  aStack_f0.mf = (cmMakefile *)
                 whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
  errorString.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_118);
  _Var1 = whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  cmListFileBacktrace::cmListFileBacktrace(&local_160,(cmListFileBacktrace *)(local_50 + 0x10));
  cmConditionEvaluator::cmConditionEvaluator
            ((cmConditionEvaluator *)local_150,(cmMakefile *)_Var1._M_pi,&local_160);
  cmListFileBacktrace::~cmListFileBacktrace(&local_160);
  do {
    args = Replay::anon_class_8_1_3fcf6657::operator()
                     (&stack0xffffffffffffff10,&this->Args,
                      (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       *)&expandArgs);
    errorString.field_2._M_local_buf[0xf] =
         cmConditionEvaluator::IsTrue
                   ((cmConditionEvaluator *)local_150,args,(string *)local_118,
                    (MessageType *)&conditionEvaluator.field_0x2c);
    if (!(bool)errorString.field_2._M_local_buf[0xf]) {
      __range2._4_4_ = 2;
LAB_006970c6:
      cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_150);
      if (__range2._4_4_ == 2) {
        uVar5 = std::__cxx11::string::empty();
        if ((((uVar5 & 1) == 0) && ((errorString.field_2._M_local_buf[0xf] & 1U) == 0)) &&
           (PVar3 = cmMakefile::GetPolicyStatus
                              ((cmMakefile *)
                               whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                               TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,CMP0130,false), PVar3 != OLD)) {
          if (PVar3 == WARN) {
            conditionEvaluator._44_4_ = 0;
            errorString.field_2._M_local_buf[0xf] = '\x01';
          }
          else if (PVar3 - NEW < 3) {
            errorString.field_2._M_local_buf[0xf] = '\x01';
          }
        }
        uVar5 = std::__cxx11::string::empty();
        auVar6._8_8_ = local_290._8_8_;
        auVar6._0_8_ = local_290._0_8_;
        if (((uVar5 & 1) == 0) &&
           (local_290 = auVar6, (errorString.field_2._M_local_buf[0xf] & 1U) != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,"while() given incorrect arguments:\n ",
                     (allocator<char> *)((long)&__range2_1 + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
          __end2_1 = std::
                     vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     begin((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)&expandArgs);
          i = (cmExpandedCommandArgument *)
              std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
              end((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  &expandArgs);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end2_1,
                               (__normal_iterator<cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
                                *)&i);
            if (!bVar2) break;
            local_260 = __gnu_cxx::
                        __normal_iterator<cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
                        ::operator*(&__end2_1);
            std::__cxx11::string::operator+=((string *)local_238," ");
            this_00 = cmExpandedCommandArgument::GetValue_abi_cxx11_(local_260);
            auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
            str._M_len = auVar6._8_8_;
            str._M_str = (char *)0x0;
            local_290 = auVar6;
            cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_280,auVar6._0_8_,str,in_R8D);
            std::__cxx11::string::operator+=((string *)local_238,(string *)&local_280);
            std::__cxx11::string::~string((string *)&local_280);
            __gnu_cxx::
            __normal_iterator<cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
            ::operator++(&__end2_1);
          }
          std::__cxx11::string::operator+=((string *)local_238,"\n");
          std::__cxx11::string::operator+=((string *)local_238,(string *)local_118);
          PVar3 = cmMakefile::GetPolicyStatus
                            ((cmMakefile *)
                             whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,CMP0130,false);
          if (PVar3 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2d0,(cmPolicies *)0x82,id);
            local_2d1 = '\n';
            cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                      (&local_2b0,&local_2d0,&local_2d1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238);
            std::__cxx11::string::operator=((string *)local_238,(string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_2d0);
          }
          this_01 = cmMakefile::GetCMakeInstance
                              ((cmMakefile *)
                               whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                               TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
          cmake::IssueMessage(this_01,conditionEvaluator._44_4_,(string *)local_238,
                              (cmListFileBacktrace *)(local_50 + 0x10));
          if (conditionEvaluator._44_4_ == 2) {
            cmSystemTools::SetFatalErrorOccurred();
          }
          std::__cxx11::string::~string((string *)local_238);
        }
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_118);
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                 &expandArgs);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_50 + 0x10));
      return (bool)(this_local._7_1_ & 1);
    }
    __end2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin(functions);
    fn = (cmListFileFunction *)
         std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end(functions);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                       *)&fn), bVar2) {
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end2);
      cmExecutionStatus::cmExecutionStatus
                ((cmExecutionStatus *)local_1d8,
                 (cmMakefile *)
                 whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var1 = whileBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
      lff = status.Variables.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_200);
      cmMakefile::ExecuteCommand
                ((cmMakefile *)_Var1._M_pi,(cmListFileFunction *)lff,(cmExecutionStatus *)local_1d8,
                 &local_200);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_200);
      bVar2 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_1d8);
      if (bVar2) {
        __x = cmExecutionStatus::GetReturnVariables_abi_cxx11_((cmExecutionStatus *)local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&err.field_2 + 8),__x);
        cmExecutionStatus::SetReturnInvoked
                  (inStatus,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&err.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&err.field_2 + 8));
        this_local._7_1_ = 1;
        __range2._4_4_ = 1;
      }
      else {
        bVar2 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)local_1d8);
        if (bVar2) {
          this_local._7_1_ = 1;
          __range2._4_4_ = 1;
        }
        else {
          bVar2 = cmExecutionStatus::GetContinueInvoked((cmExecutionStatus *)local_1d8);
          if (bVar2) {
            __range2._4_4_ = 4;
          }
          else {
            bVar2 = cmExecutionStatus::HasExitCode((cmExecutionStatus *)local_1d8);
            if (bVar2) {
              code = cmExecutionStatus::GetExitCode((cmExecutionStatus *)local_1d8);
              cmExecutionStatus::SetExitCode(inStatus,code);
              this_local._7_1_ = 1;
              __range2._4_4_ = 1;
            }
            else {
              bVar2 = cmSystemTools::GetFatalErrorOccurred();
              if (bVar2) {
                this_local._7_1_ = 1;
                __range2._4_4_ = 1;
              }
              else {
                __range2._4_4_ = 0;
              }
            }
          }
        }
      }
      cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_1d8);
      if (__range2._4_4_ != 0) {
        if (__range2._4_4_ != 4) goto LAB_006970c6;
        break;
      }
      __gnu_cxx::
      __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
      ::operator++(&__end2);
    }
  } while( true );
}

Assistant:

bool cmWhileFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  cmListFileBacktrace whileBT =
    mf.GetBacktrace().Push(this->GetStartingContext());

  std::vector<cmExpandedCommandArgument> expandedArguments;
  // At least same size expected for `expandedArguments` as `Args`
  expandedArguments.reserve(this->Args.size());

  auto expandArgs = [&mf](std::vector<cmListFileArgument> const& args,
                          std::vector<cmExpandedCommandArgument>& out)
    -> std::vector<cmExpandedCommandArgument>& {
    out.clear();
    mf.ExpandArguments(args, out);
    return out;
  };

  // For compatibility with projects that do not set CMP0130 to NEW,
  // we tolerate condition errors that evaluate to false.
  bool enforceError = true;
  std::string errorString;
  MessageType messageType;

  for (cmConditionEvaluator conditionEvaluator(mf, whileBT);
       (enforceError = /* enforce condition errors that evaluate to true */
        conditionEvaluator.IsTrue(expandArgs(this->Args, expandedArguments),
                                  errorString, messageType));) {
    // Invoke all the functions that were collected in the block.
    for (cmListFileFunction const& fn : functions) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(fn, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        return true;
      }
      if (status.GetContinueInvoked()) {
        break;
      }
      if (status.HasExitCode()) {
        inStatus.SetExitCode(status.GetExitCode());
        return true;
      }
      if (cmSystemTools::GetFatalErrorOccurred()) {
        return true;
      }
    }
  }

  if (!errorString.empty() && !enforceError) {
    // This error should only be enforced if CMP0130 is NEW.
    switch (mf.GetPolicyStatus(cmPolicies::CMP0130)) {
      case cmPolicies::WARN:
        // Convert the error to a warning and enforce it.
        messageType = MessageType::AUTHOR_WARNING;
        enforceError = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to silently ignore the error.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        // NEW behavior is to enforce the error.
        enforceError = true;
        break;
    }
  }

  if (!errorString.empty() && enforceError) {
    std::string err = "while() given incorrect arguments:\n ";
    for (auto const& i : expandedArguments) {
      err += " ";
      err += cmOutputConverter::EscapeForCMake(i.GetValue());
    }
    err += "\n";
    err += errorString;
    if (mf.GetPolicyStatus(cmPolicies::CMP0130) == cmPolicies::WARN) {
      err =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0130), '\n', err);
    }
    mf.GetCMakeInstance()->IssueMessage(messageType, err, whileBT);
    if (messageType == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return true;
}